

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::dispose(Synth *this)

{
  Display *pDVar1;
  MidiEventQueue *this_00;
  PartialManager *this_01;
  int local_24;
  int local_20;
  int i_1;
  int i;
  Synth *this_local;
  
  this->opened = false;
  pDVar1 = this->extensions->display;
  if (pDVar1 != (Display *)0x0) {
    operator_delete(pDVar1);
  }
  this->extensions->display = (Display *)0x0;
  this_00 = this->midiQueue;
  if (this_00 != (MidiEventQueue *)0x0) {
    MidiEventQueue::~MidiEventQueue(this_00);
    operator_delete(this_00);
  }
  this->midiQueue = (MidiEventQueue *)0x0;
  if (this->renderer != (Renderer *)0x0) {
    (*this->renderer->_vptr_Renderer[1])();
  }
  this->renderer = (Renderer *)0x0;
  if (this->analog != (Analog *)0x0) {
    (*this->analog->_vptr_Analog[1])();
  }
  this->analog = (Analog *)0x0;
  this_01 = this->partialManager;
  if (this_01 != (PartialManager *)0x0) {
    PartialManager::~PartialManager(this_01);
    operator_delete(this_01);
  }
  this->partialManager = (PartialManager *)0x0;
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    if (this->parts[local_20] != (Part *)0x0) {
      (*this->parts[local_20]->_vptr_Part[1])();
    }
    this->parts[local_20] = (Part *)0x0;
  }
  if (this->soundGroupNames != (char (*) [9])0x0) {
    operator_delete__(this->soundGroupNames);
  }
  this->soundGroupNames = (char (*) [9])0x0;
  if (this->pcmWaves != (PCMWaveEntry *)0x0) {
    operator_delete__(this->pcmWaves);
  }
  this->pcmWaves = (PCMWaveEntry *)0x0;
  if (this->pcmROMData != (Bit16s *)0x0) {
    operator_delete__(this->pcmROMData);
  }
  this->pcmROMData = (Bit16s *)0x0;
  deleteMemoryRegions(this);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if (this->reverbModels[local_24] != (BReverbModel *)0x0) {
      (*this->reverbModels[local_24]->_vptr_BReverbModel[1])();
    }
    this->reverbModels[local_24] = (BReverbModel *)0x0;
  }
  this->reverbModel = (BReverbModel *)0x0;
  this->controlROMFeatures = (ControlROMFeatureSet *)0x0;
  this->controlROMMap = (ControlROMMap *)0x0;
  return;
}

Assistant:

void Synth::dispose() {
	opened = false;

	delete extensions.display;
	extensions.display = NULL;

	delete midiQueue;
	midiQueue = NULL;

	delete renderer;
	renderer = NULL;

	delete analog;
	analog = NULL;

	delete partialManager;
	partialManager = NULL;

	for (int i = 0; i < 9; i++) {
		delete parts[i];
		parts[i] = NULL;
	}

	delete[] soundGroupNames;
	soundGroupNames = NULL;

	delete[] pcmWaves;
	pcmWaves = NULL;

	delete[] pcmROMData;
	pcmROMData = NULL;

	deleteMemoryRegions();

	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		delete reverbModels[i];
		reverbModels[i] = NULL;
	}
	reverbModel = NULL;
	controlROMFeatures = NULL;
	controlROMMap = NULL;
}